

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

int opn2_generateFormat(OPN2_MIDIPlayer *device,int sampleCount,OPN2_UInt8 *out_left,
                       OPN2_UInt8 *out_right,OPNMIDI_AudioFormat *format)

{
  unsigned_long uVar1;
  uint uVar2;
  OPNMIDIplay *this;
  int samples_requested;
  int iVar3;
  int32_t *_in;
  OPN2 *pOVar4;
  reference pAVar5;
  OPNChipBase *pOVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long local_b8;
  double local_b0;
  ulong local_a8;
  size_t card;
  uint chips;
  Synth *synth;
  int32_t *out_buf;
  ssize_t in_generatedPhys;
  ssize_t in_generatedStereo;
  ssize_t leftSamples;
  double eat_delay;
  double delay;
  long lStack_58;
  int left;
  ssize_t n_periodCountStereo;
  ssize_t gotten_len;
  Setup *setup;
  MidiPlayer *player;
  OPNMIDI_AudioFormat *format_local;
  OPN2_UInt8 *out_right_local;
  OPN2_UInt8 *out_left_local;
  int sampleCount_local;
  OPN2_MIDIPlayer *device_local;
  
  samples_requested = sampleCount - sampleCount % 2;
  if (samples_requested < 0) {
    device_local._4_4_ = 0;
  }
  else if (device == (OPN2_MIDIPlayer *)0x0) {
    device_local._4_4_ = 0;
  }
  else {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("player",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x4e8,
                    "int opn2_generateFormat(struct OPN2_MIDIPlayer *, int, OPN2_UInt8 *, OPN2_UInt8 *, const OPNMIDI_AudioFormat *)"
                   );
    }
    n_periodCountStereo = 0;
    uVar1 = (this->m_setup).PCM_RATE;
    auVar8._8_4_ = (int)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    eat_delay = (double)(samples_requested / 2) /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    delay._4_4_ = samples_requested;
    while (0 < delay._4_4_) {
      if (eat_delay <= 0.0) {
        uVar1 = (this->m_setup).PCM_RATE;
        auVar9._8_4_ = (int)(uVar1 >> 0x20);
        auVar9._0_8_ = uVar1;
        auVar9._12_4_ = 0x45300000;
        eat_delay = (double)(delay._4_4_ / 2) /
                    ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      }
      if ((this->m_setup).maxdelay <= eat_delay) {
        local_b0 = (this->m_setup).maxdelay;
      }
      else {
        local_b0 = eat_delay;
      }
      eat_delay = eat_delay - local_b0;
      uVar1 = (this->m_setup).PCM_RATE;
      auVar7._8_4_ = (int)(uVar1 >> 0x20);
      auVar7._0_8_ = uVar1;
      auVar7._12_4_ = 0x45300000;
      (this->m_setup).carry =
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * local_b0 +
           (this->m_setup).carry;
      lStack_58 = (long)(this->m_setup).carry;
      (this->m_setup).carry = (this->m_setup).carry - (double)lStack_58;
      if (delay._4_4_ / 2 < lStack_58) {
        lStack_58 = (long)(delay._4_4_ / 2);
      }
      if (lStack_58 < 0x201) {
        local_b8 = lStack_58;
      }
      else {
        local_b8 = 0x200;
      }
      _in = this->m_outBuf;
      memset(_in,0,local_b8 << 3);
      pOVar4 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*(&this->m_synth);
      uVar2 = pOVar4->m_numChips;
      if (uVar2 == 1) {
        pAVar5 = std::
                 vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                 ::operator[](&pOVar4->m_chips,0);
        pOVar6 = AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::operator->(pAVar5);
        (*pOVar6->_vptr_OPNChipBase[0x12])(pOVar6,_in,local_b8);
      }
      else {
        for (local_a8 = 0; local_a8 < uVar2; local_a8 = local_a8 + 1) {
          pAVar5 = std::
                   vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                   ::operator[](&pOVar4->m_chips,local_a8);
          pOVar6 = AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::operator->
                             (pAVar5);
          (*pOVar6->_vptr_OPNChipBase[0x13])(pOVar6,_in,local_b8);
        }
      }
      iVar3 = SendStereoAudio(samples_requested,local_b8,_in,n_periodCountStereo,out_left,out_right,
                              format);
      if (iVar3 == -1) {
        return 0;
      }
      delay._4_4_ = delay._4_4_ - (int)(local_b8 * 2);
      n_periodCountStereo = local_b8 * 2 + n_periodCountStereo;
      OPNMIDIplay::TickIterators(this,local_b0);
    }
    device_local._4_4_ = (int)n_periodCountStereo;
  }
  return device_local._4_4_;
}

Assistant:

OPNMIDI_EXPORT int opn2_generateFormat(struct OPN2_MIDIPlayer *device, int sampleCount,
                                       OPN2_UInt8 *out_left, OPN2_UInt8 *out_right,
                                       const OPNMIDI_AudioFormat *format)
{
    sampleCount -= sampleCount % 2; //Avoid even sample requests
    if(sampleCount < 0)
        return 0;
    if(!device)
        return 0;

    MidiPlayer *player = GET_MIDI_PLAYER(device);
    assert(player);
    MidiPlayer::Setup &setup = player->m_setup;

    ssize_t gotten_len = 0;
    ssize_t n_periodCountStereo = 512;

    int     left = sampleCount;
    double  delay = double(sampleCount / 2) / double(setup.PCM_RATE);

    while(left > 0)
    {
        if(delay <= 0.0)
            delay = double(left / 2) / double(setup.PCM_RATE);
        const double eat_delay = delay < setup.maxdelay ? delay : setup.maxdelay;
        delay -= eat_delay;
        setup.carry += double(setup.PCM_RATE) * eat_delay;
        n_periodCountStereo = static_cast<ssize_t>(setup.carry);
        setup.carry -= double(n_periodCountStereo);

        {
            ssize_t leftSamples = left / 2;
            if(n_periodCountStereo > leftSamples)
                n_periodCountStereo = leftSamples;
            //! Count of stereo samples
            ssize_t in_generatedStereo = (n_periodCountStereo > 512) ? 512 : n_periodCountStereo;
            //! Total count of samples
            ssize_t in_generatedPhys = in_generatedStereo * 2;
            //! Unsigned total sample count
            //fill buffer with zeros
            int32_t *out_buf = player->m_outBuf;
            std::memset(out_buf, 0, static_cast<size_t>(in_generatedPhys) * sizeof(out_buf[0]));
            Synth &synth = *player->m_synth;
            unsigned int chips = synth.m_numChips;
            if(chips == 1)
                synth.m_chips[0]->generate32(out_buf, (size_t)in_generatedStereo);
            else/* if(n_periodCountStereo > 0)*/
            {
                /* Generate data from every chip and mix result */
                for(size_t card = 0; card < chips; ++card)
                    synth.m_chips[card]->generateAndMix32(out_buf, (size_t)in_generatedStereo);
            }
            /* Process it */
            if(SendStereoAudio(sampleCount, in_generatedStereo, out_buf, gotten_len, out_left, out_right, format) == -1)
                return 0;

            left -= (int)in_generatedPhys;
            gotten_len += (in_generatedPhys) /* - setup.stored_samples*/;
        }

        player->TickIterators(eat_delay);
    }

    return static_cast<int>(gotten_len);
}